

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O2

void __thiscall ON_UserData::ON_UserData(ON_UserData *this,ON_UserData *src)

{
  uint uVar1;
  undefined8 uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  long lVar5;
  ON_Xform *pOVar6;
  ON_Xform *pOVar7;
  byte bVar8;
  
  bVar8 = 0;
  ON_Object::ON_Object(&this->super_ON_Object,&src->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_0082dde8;
  uVar3 = (src->m_userdata_uuid).Data2;
  uVar4 = (src->m_userdata_uuid).Data3;
  uVar2 = *(undefined8 *)(src->m_userdata_uuid).Data4;
  (this->m_userdata_uuid).Data1 = (src->m_userdata_uuid).Data1;
  (this->m_userdata_uuid).Data2 = uVar3;
  (this->m_userdata_uuid).Data3 = uVar4;
  *(undefined8 *)(this->m_userdata_uuid).Data4 = uVar2;
  uVar3 = (src->m_application_uuid).Data2;
  uVar4 = (src->m_application_uuid).Data3;
  uVar2 = *(undefined8 *)(src->m_application_uuid).Data4;
  (this->m_application_uuid).Data1 = (src->m_application_uuid).Data1;
  (this->m_application_uuid).Data2 = uVar3;
  (this->m_application_uuid).Data3 = uVar4;
  *(undefined8 *)(this->m_application_uuid).Data4 = uVar2;
  uVar1 = src->m_userdata_copycount;
  this->m_userdata_copycount = uVar1;
  pOVar6 = &src->m_userdata_xform;
  pOVar7 = &this->m_userdata_xform;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar7->m_xform[0][0] = pOVar6->m_xform[0][0];
    pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
    pOVar7 = (ON_Xform *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  this->m_userdata_owner = (ON_Object *)0x0;
  this->m_userdata_next = (ON_UserData *)0x0;
  if (uVar1 != 0) {
    this->m_userdata_copycount = uVar1 + 1 + (uint)(uVar1 == 0xffffffff);
  }
  return;
}

Assistant:

ON_UserData::ON_UserData(const ON_UserData& src) 
            : ON_Object(src),
              m_userdata_uuid(src.m_userdata_uuid), 
              m_application_uuid(src.m_application_uuid),
              m_userdata_copycount(src.m_userdata_copycount),
              m_userdata_xform(src.m_userdata_xform),
              m_userdata_owner(0), // do not copy owner
              m_userdata_next(0)   // do not copy next
{
  if ( m_userdata_copycount) 
  {
    m_userdata_copycount++;
    if ( !m_userdata_copycount )
      m_userdata_copycount = 1;
  }
}